

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFormFieldObjectHelper.cc
# Opt level: O2

QPDFObjectHandle __thiscall
QPDFFormFieldObjectHelper::getFontFromResource
          (QPDFFormFieldObjectHelper *this,QPDFObjectHandle *resources,string *name)

{
  bool bVar1;
  string *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  QPDFObjectHandle QVar3;
  allocator<char> local_82;
  allocator<char> local_81;
  undefined1 local_80 [16];
  QPDFObjectHandle local_70;
  string local_60 [32];
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_40 [2];
  
  (this->super_QPDFObjectHelper)._vptr_QPDFObjectHelper = (_func_int **)0x0;
  (this->super_QPDFObjectHelper).super_BaseHandle.obj.
  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  bVar1 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)name);
  _Var2._M_pi = extraout_RDX;
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>(local_60,"/Font",&local_81);
    QPDFObjectHandle::getKey((QPDFObjectHandle *)local_80,name);
    bVar1 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)local_80);
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>((string *)local_40,"/Font",&local_82);
      QPDFObjectHandle::getKey(&local_70,name);
      bVar1 = QPDFObjectHandle::hasKey(&local_70,in_RCX);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_70.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__cxx11::string::~string((string *)local_40);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_80 + 8));
      std::__cxx11::string::~string(local_60);
      _Var2._M_pi = extraout_RDX_00;
      if (!bVar1) goto LAB_0015af74;
      std::__cxx11::string::string<std::allocator<char>>
                (local_60,"/Font",(allocator<char> *)&local_70);
      QPDFObjectHandle::getKey((QPDFObjectHandle *)local_80,name);
      QPDFObjectHandle::getKey((QPDFObjectHandle *)local_40,(string *)local_80);
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)this,local_40);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40[0]._M_refcount);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_80 + 8));
    std::__cxx11::string::~string(local_60);
    _Var2._M_pi = extraout_RDX_01;
  }
LAB_0015af74:
  QVar3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var2._M_pi;
  QVar3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDFFormFieldObjectHelper::getFontFromResource(QPDFObjectHandle resources, std::string const& name)
{
    QPDFObjectHandle result;
    if (resources.isDictionary() && resources.getKey("/Font").isDictionary() &&
        resources.getKey("/Font").hasKey(name)) {
        result = resources.getKey("/Font").getKey(name);
    }
    return result;
}